

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAliases.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  uint8_t *start;
  ostream *poVar2;
  ValueLength VVar3;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this;
  void *this_00;
  ostream *poVar4;
  uint64_t uVar5;
  undefined1 *puVar6;
  exception *ex;
  Slice *it;
  default_sentinel_t __end1;
  ArrayIterator __begin1;
  VPackArrayIterator *__range1;
  VPackSlice s;
  size_t i;
  VPackBuilder b;
  undefined7 in_stack_fffffffffffffdd8;
  ValueType in_stack_fffffffffffffddf;
  Builder *in_stack_fffffffffffffde0;
  ArrayIterator *in_stack_fffffffffffffde8;
  Slice in_stack_fffffffffffffdf0;
  Builder *in_stack_fffffffffffffe10;
  uint8_t *local_170;
  uint8_t **local_168;
  ArrayIterator local_158;
  uint8_t *local_138;
  ArrayIterator local_130;
  ArrayIterator *local_110;
  Slice local_108;
  undefined1 local_100 [16];
  ulong local_f0;
  undefined1 local_e8 [32];
  Builder local_c8;
  int local_4;
  
  local_4 = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffffe10);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffdf0._start,
             (ValueType)((ulong)in_stack_fffffffffffffde8 >> 0x38),
             SUB81((ulong)in_stack_fffffffffffffde8 >> 0x30,0));
  puVar6 = local_e8;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffde0,
             (Value *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  for (local_f0 = 0; local_f0 < 10; local_f0 = local_f0 + 1) {
    puVar6 = local_100;
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffde0,
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),None);
    arangodb::velocypack::Builder::add
              (in_stack_fffffffffffffde0,
               (Value *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  }
  arangodb::velocypack::Builder::close(&local_c8,(int)puVar6);
  start = arangodb::velocypack::Builder::start(in_stack_fffffffffffffde0);
  arangodb::velocypack::Slice::Slice(&local_108,start);
  std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar2 = arangodb::velocypack::operator<<
                     ((ostream *)in_stack_fffffffffffffde0,
                      (Slice *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Type: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
             in_stack_fffffffffffffde0);
  poVar2 = operator<<((ostream *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddf);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  VVar3 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     in_stack_fffffffffffffde0);
  this = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
         std::ostream::operator<<(poVar2,VVar3);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Members: ");
  VVar3 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::length(this);
  this_00 = (void *)std::ostream::operator<<(poVar2,VVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Iterating Array members:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_138 = local_108._start;
  arangodb::velocypack::ArrayIterator::ArrayIterator
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
  local_110 = &local_130;
  arangodb::velocypack::ArrayIterator::begin(&local_158,local_110);
  arangodb::velocypack::ArrayIterator::end(local_110);
  while( true ) {
    bVar1 = arangodb::velocypack::ArrayIterator::operator==(&local_158);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_170 = (uint8_t *)
                arangodb::velocypack::ArrayIterator::operator*
                          ((ArrayIterator *)
                           CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    local_168 = &local_170;
    poVar4 = arangodb::velocypack::operator<<
                       ((ostream *)in_stack_fffffffffffffde0,
                        (Slice *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    poVar4 = std::operator<<(poVar4,", number value: ");
    uVar5 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)poVar2
                      );
    in_stack_fffffffffffffde0 = (Builder *)std::ostream::operator<<(poVar4,uVar5);
    std::ostream::operator<<(in_stack_fffffffffffffde0,std::endl<char,std::char_traits<char>>);
    arangodb::velocypack::ArrayIterator::operator++((ArrayIterator *)in_stack_fffffffffffffde0);
  }
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffde0);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  VPackBuilder b;

  b(VPackValue(VPackValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(VPackValue(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  VPackSlice s(b.start());

  // inspect the outermost value (should be an Array...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : VPackArrayIterator(s)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}